

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

void __thiscall
cmCTestBuildHandler::LaunchHelper::LaunchHelper(LaunchHelper *this,cmCTestBuildHandler *handler)

{
  ulong uVar1;
  allocator<char> local_91;
  undefined1 local_90 [8];
  string launchEnv;
  string local_60;
  string *local_40;
  string *launchDir;
  string tag;
  cmCTestBuildHandler *handler_local;
  LaunchHelper *this_local;
  
  this->Handler = handler;
  this->CTest = (handler->super_cmCTestGenericHandler).CTest;
  tag.field_2._8_8_ = handler;
  cmCTest::GetCurrentTag_abi_cxx11_((string *)&launchDir,this->CTest);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_40 = &this->Handler->CTestLaunchDir;
    cmCTest::GetBinaryDir_abi_cxx11_(&local_60,this->CTest);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::operator+=((string *)local_40,"/Testing/");
    std::__cxx11::string::operator+=((string *)local_40,(string *)&launchDir);
    std::__cxx11::string::operator+=((string *)local_40,"/Build");
    cmsys::SystemTools::RemoveADirectory(local_40);
    if ((this->Handler->UseCTestLaunch & 1U) != 0) {
      cmsys::SystemTools::MakeDirectory(local_40,(mode_t *)0x0);
      WriteLauncherConfig(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_90,"CTEST_LAUNCH_LOGS=",&local_91);
      std::allocator<char>::~allocator(&local_91);
      std::__cxx11::string::operator+=((string *)local_90,(string *)local_40);
      cmsys::SystemTools::PutEnv((string *)local_90);
      std::__cxx11::string::~string((string *)local_90);
    }
  }
  else {
    this->Handler->UseCTestLaunch = false;
  }
  if ((this->Handler->UseCTestLaunch & 1U) == 0) {
    cmSystemTools::UnsetEnv("CTEST_LAUNCH_LOGS");
  }
  std::__cxx11::string::~string((string *)&launchDir);
  return;
}

Assistant:

cmCTestBuildHandler::LaunchHelper::LaunchHelper(cmCTestBuildHandler* handler)
  : Handler(handler)
  , CTest(handler->CTest)
{
  std::string tag = this->CTest->GetCurrentTag();
  if (tag.empty()) {
    // This is not for a dashboard submission, so there is no XML.
    // Skip enabling the launchers.
    this->Handler->UseCTestLaunch = false;
  } else {
    // Compute a directory in which to store launcher fragments.
    std::string& launchDir = this->Handler->CTestLaunchDir;
    launchDir = this->CTest->GetBinaryDir();
    launchDir += "/Testing/";
    launchDir += tag;
    launchDir += "/Build";

    // Clean out any existing launcher fragments.
    cmSystemTools::RemoveADirectory(launchDir);

    if (this->Handler->UseCTestLaunch) {
      // Enable launcher fragments.
      cmSystemTools::MakeDirectory(launchDir);
      this->WriteLauncherConfig();
      std::string launchEnv = "CTEST_LAUNCH_LOGS=";
      launchEnv += launchDir;
      cmSystemTools::PutEnv(launchEnv);
    }
  }

  // If not using launchers, make sure they passthru.
  if (!this->Handler->UseCTestLaunch) {
    cmSystemTools::UnsetEnv("CTEST_LAUNCH_LOGS");
  }
}